

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int read_line(lua_State *L,FILE *f,int chop)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  luaL_Buffer b;
  luaL_Buffer local_2050;
  
  luaL_buffinit(L,&local_2050);
  iVar1 = 0;
  do {
    if ((iVar1 == -1) || (iVar1 == 10)) {
      if (chop == 0 && iVar1 == 10) {
        if (local_2050.size <= local_2050.n) {
          luaL_prepbuffsize(&local_2050,1);
        }
        local_2050.b[local_2050.n] = '\n';
        local_2050.n = local_2050.n + 1;
        luaL_pushresult(&local_2050);
        uVar2 = 1;
      }
      else {
        luaL_pushresult(&local_2050);
        uVar2 = 1;
        if (iVar1 != 10) {
          sVar4 = lua_rawlen(L,-1);
          uVar2 = (uint)(sVar4 != 0);
        }
      }
      return uVar2;
    }
    pcVar3 = luaL_prepbuffsize(&local_2050,0x2000);
    flockfile((FILE *)f);
    uVar5 = 0;
    do {
      iVar1 = getc_unlocked((FILE *)f);
      if ((iVar1 == -1) || (iVar1 == 10)) goto LAB_0013e54a;
      pcVar3[uVar5] = (char)iVar1;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x2000);
    uVar5 = 0x2000;
LAB_0013e54a:
    funlockfile((FILE *)f);
    local_2050.n = local_2050.n + (uVar5 & 0xffffffff);
  } while( true );
}

Assistant:

static int read_line (lua_State *L, FILE *f, int chop) {
  luaL_Buffer b;
  int c = '\0';
  luaL_buffinit(L, &b);
  while (c != EOF && c != '\n') {  /* repeat until end of line */
    char *buff = luaL_prepbuffer(&b);  /* preallocate buffer */
    int i = 0;
    l_lockfile(f);  /* no memory errors can happen inside the lock */
    while (i < LUAL_BUFFERSIZE && (c = l_getc(f)) != EOF && c != '\n')
      buff[i++] = c;
    l_unlockfile(f);
    luaL_addsize(&b, i);
  }
  if (!chop && c == '\n')  /* want a newline and have one? */
    luaL_addchar(&b, c);  /* add ending newline to result */
  luaL_pushresult(&b);  /* close buffer */
  /* return ok if read something (either a newline or something else) */
  return (c == '\n' || lua_rawlen(L, -1) > 0);
}